

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::FragmentDataLocationAPITest::prepareFramebuffer
          (FragmentDataLocationAPITest *this,Framebuffer *framebuffer,Texture *color_0_texture)

{
  GLuint GVar1;
  int iVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  GLenum buffers [4];
  
  TextureTestBase::prepareFramebuffer(&this->super_TextureTestBase,framebuffer,color_0_texture);
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&texture_data,0x100);
  if ((long)texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar4 = 0;
    do {
      texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = 0x20406080;
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 0xffffffff) <
             (ulong)((long)texture_data.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)texture_data.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  Utils::Texture::Init
            (&this->m_goku,TEX_2D,0x10,0x10,0,0x8058,0x1908,0x1401,
             texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  Utils::Texture::Init
            (&this->m_gohan,TEX_2D,0x10,0x10,0,0x8058,0x1908,0x1401,
             texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  Utils::Texture::Init
            (&this->m_goten,TEX_2D,0x10,0x10,0,0x8058,0x1908,0x1401,
             texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  Utils::Texture::Init
            (&this->m_chichi,TEX_2D,0x10,0x10,0,0x8058,0x1908,0x1401,
             texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  Utils::Framebuffer::Bind(framebuffer);
  GVar1 = (this->m_goku).m_id;
  iVar3 = this->m_goku_location;
  iVar2 = (*framebuffer->m_context->m_renderCtx->_vptr_RenderContext[3])();
  Utils::Framebuffer::AttachTexture
            ((Functions *)CONCAT44(extraout_var,iVar2),iVar3 + 0x8ce0,GVar1,0x10,0x10);
  GVar1 = (this->m_gohan).m_id;
  iVar3 = this->m_gohan_location;
  iVar2 = (*framebuffer->m_context->m_renderCtx->_vptr_RenderContext[3])();
  Utils::Framebuffer::AttachTexture
            ((Functions *)CONCAT44(extraout_var_00,iVar2),iVar3 + 0x8ce0,GVar1,0x10,0x10);
  GVar1 = (this->m_goten).m_id;
  iVar3 = (*framebuffer->m_context->m_renderCtx->_vptr_RenderContext[3])();
  Utils::Framebuffer::AttachTexture
            ((Functions *)CONCAT44(extraout_var_01,iVar3),0x8ce6,GVar1,0x10,0x10);
  GVar1 = (this->m_chichi).m_id;
  iVar3 = this->m_chichi_location;
  iVar2 = (*framebuffer->m_context->m_renderCtx->_vptr_RenderContext[3])();
  Utils::Framebuffer::AttachTexture
            ((Functions *)CONCAT44(extraout_var_02,iVar2),iVar3 + 0x8ce0,GVar1,0x10,0x10);
  iVar3 = (*((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_03,iVar3) + 0x560))(4);
  err = (**(code **)(CONCAT44(extraout_var_03,iVar3) + 0x800))();
  glu::checkError(err,"DrawBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x4b76);
  if (texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)texture_data.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texture_data.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FragmentDataLocationAPITest::prepareFramebuffer(Utils::Framebuffer& framebuffer, Utils::Texture& color_0_texture)
{
	/* Let parent prepare its stuff */
	TextureTestBase::prepareFramebuffer(framebuffer, color_0_texture);

	/* Prepare data */
	std::vector<GLuint> texture_data;
	texture_data.resize(m_width * m_height);

	for (GLuint i = 0; i < texture_data.size(); ++i)
	{
		texture_data[i] = 0x20406080;
	}

	/* Prepare textures */
	m_goku.Init(Utils::Texture::TEX_2D, m_width, m_height, 0, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);

	m_gohan.Init(Utils::Texture::TEX_2D, m_width, m_height, 0, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);

	m_goten.Init(Utils::Texture::TEX_2D, m_width, m_height, 0, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);

	m_chichi.Init(Utils::Texture::TEX_2D, m_width, m_height, 0, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);

	/* Attach textures to framebuffer */
	framebuffer.Bind();
	framebuffer.AttachTexture(GL_COLOR_ATTACHMENT0 + m_goku_location, m_goku.m_id, m_width, m_height);
	framebuffer.AttachTexture(GL_COLOR_ATTACHMENT0 + m_gohan_location, m_gohan.m_id, m_width, m_height);
	framebuffer.AttachTexture(GL_COLOR_ATTACHMENT0 + m_goten_location, m_goten.m_id, m_width, m_height);
	framebuffer.AttachTexture(GL_COLOR_ATTACHMENT0 + m_chichi_location, m_chichi.m_id, m_width, m_height);

	/* Set up drawbuffers */
	const Functions& gl = m_context.getRenderContext().getFunctions();
	//  1. There are only 4 outputs in fragment shader, so only need to do buffer mapping for 4 attachments,
	//  2. another issue is each output variable has a location, it is the fragment color index, so the index of
	//  GL_COLOR_ATTACHMENT in glDrawBuffers() should keep the same with the location, to make test correct,
	//  we needt to change the above code of glDrawBuffers() as :
	GLint  buffers_size = 4;
	GLenum buffers[]	= { GLenum(GL_COLOR_ATTACHMENT0 + m_chichi_location),
						 GLenum(GL_COLOR_ATTACHMENT0 + m_goku_location),
						 GLenum(GL_COLOR_ATTACHMENT0 + m_goten_location),
						 GLenum(GL_COLOR_ATTACHMENT0 + m_gohan_location) };
	gl.drawBuffers(buffers_size, buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawBuffers");
}